

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utilities.cpp
# Opt level: O2

uint16_t XPMP2::PJWHash16(char *pc)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  
  uVar3 = 0;
  while (bVar1 = *pc, bVar1 != 0) {
    pc = (char *)((byte *)pc + 1);
    uVar2 = (uint)bVar1 + uVar3 * 4;
    uVar3 = (uVar2 & 0xffff) >> 0xe;
    if ((uVar2 & 0xc000) == 0) {
      uVar3 = 0;
    }
    uVar3 = ~(uVar2 & 0xc000) & (uVar3 ^ uVar2);
  }
  return (uint16_t)uVar3;
}

Assistant:

std::uint16_t PJWHash16(const char *pc)
{
    std::uint16_t h = 0, high;
    const unsigned char* s = reinterpret_cast<const unsigned char*>(pc);
    while (*s)
    {
        h <<= 2;                    // shift by 2 bits only, not 4
        h += *s++;
        high = h & 0xC000;          // pick the upper 2 bits only, not 4
        if (high)
            h ^= high >> 14;
        h &= ~high;
    }
    return h;
}